

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixRotateZYX(Matrix *__return_storage_ptr__,Vector3 ang)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Matrix *result;
  float sx;
  float cx;
  float sy;
  float cy;
  float sz;
  float cz;
  float local_14;
  float fStack_10;
  Vector3 ang_local;
  
  memset(__return_storage_ptr__,0,0x40);
  fVar1 = cosf(ang.z);
  fVar2 = sinf(ang.z);
  fStack_10 = ang.y;
  fVar3 = cosf(fStack_10);
  fVar4 = sinf(fStack_10);
  local_14 = ang.x;
  fVar5 = cosf(local_14);
  fVar6 = sinf(local_14);
  __return_storage_ptr__->m0 = fVar1 * fVar3;
  __return_storage_ptr__->m1 = fVar1 * fVar4 * fVar6 + -(fVar5 * fVar2);
  __return_storage_ptr__->m2 = fVar2 * fVar6 + fVar1 * fVar5 * fVar4;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m4 = fVar3 * fVar2;
  __return_storage_ptr__->m5 = fVar1 * fVar5 + fVar2 * fVar4 * fVar6;
  __return_storage_ptr__->m6 = fVar5 * fVar2 * fVar4 + -(fVar1 * fVar6);
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m8 = -fVar4;
  __return_storage_ptr__->m9 = fVar3 * fVar6;
  __return_storage_ptr__->m10 = fVar3 * fVar5;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotateZYX(Vector3 ang)
{
    Matrix result = { 0 };

    float cz = cosf(ang.z);
    float sz = sinf(ang.z);
    float cy = cosf(ang.y);
    float sy = sinf(ang.y);
    float cx = cosf(ang.x);
    float sx = sinf(ang.x);

    result.m0 = cz*cy;
    result.m1 = cz*sy*sx - cx*sz;
    result.m2 = sz*sx + cz*cx*sy;
    result.m3 = 0;

    result.m4 = cy*sz;
    result.m5 = cz*cx + sz*sy*sx;
    result.m6 = cx*sz*sy - cz*sx;
    result.m7 = 0;

    result.m8 = -sy;
    result.m9 = cy*sx;
    result.m10 = cy*cx;
    result.m11 = 0;

    result.m12 = 0;
    result.m13 = 0;
    result.m14 = 0;
    result.m15 = 1;

    return result;
}